

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O2

void av1_dr_prediction_z2_c
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int upsample_left,int dx,int dy)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  uint8_t *puVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int shift;
  uint uVar10;
  uint uVar11;
  int c;
  ulong uVar12;
  
  bVar4 = (byte)upsample_above;
  uVar5 = (ulong)(uint)bw;
  if (bw < 1) {
    uVar5 = 0;
  }
  iVar3 = 0;
  if (bh < 1) {
    bh = 0;
  }
  iVar8 = -dx;
  for (uVar11 = 0; uVar11 != bh; uVar11 = uVar11 + 1) {
    uVar10 = (~uVar11 * dx << (bVar4 & 0x1f)) >> 1 & 0x1f;
    iVar9 = iVar8;
    iVar7 = -dy;
    for (uVar12 = 0; uVar5 != uVar12; uVar12 = uVar12 + 1) {
      iVar1 = iVar9 >> (6 - bVar4 & 0x1f);
      if (iVar1 < -1 << (bVar4 & 0x1f)) {
        iVar1 = iVar3 + iVar7 >> (6 - (byte)upsample_left & 0x1f);
        uVar2 = (uint)(iVar7 << ((byte)upsample_left & 0x1f)) >> 1 & 0x1f;
        puVar6 = left + iVar1;
        iVar1 = (0x20 - uVar2) * (uint)left[iVar1];
      }
      else {
        puVar6 = above + iVar1;
        iVar1 = (uint)above[iVar1] * (0x20 - uVar10);
        uVar2 = uVar10;
      }
      dst[uVar12] = (uint8_t)(puVar6[1] * uVar2 + iVar1 + 0x10 >> 5);
      iVar7 = iVar7 - dy;
      iVar9 = iVar9 + 0x40;
    }
    dst = dst + stride;
    iVar3 = iVar3 + 0x40;
    iVar8 = iVar8 - dx;
  }
  return;
}

Assistant:

void av1_dr_prediction_z2_c(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                            const uint8_t *above, const uint8_t *left,
                            int upsample_above, int upsample_left, int dx,
                            int dy) {
  assert(dx > 0);
  assert(dy > 0);

  const int min_base_x = -(1 << upsample_above);
  const int min_base_y = -(1 << upsample_left);
  (void)min_base_y;
  const int frac_bits_x = 6 - upsample_above;
  const int frac_bits_y = 6 - upsample_left;

  for (int r = 0; r < bh; ++r) {
    for (int c = 0; c < bw; ++c) {
      int val;
      int y = r + 1;
      int x = (c << 6) - y * dx;
      const int base_x = x >> frac_bits_x;
      if (base_x >= min_base_x) {
        const int shift = ((x * (1 << upsample_above)) & 0x3F) >> 1;
        val = above[base_x] * (32 - shift) + above[base_x + 1] * shift;
        val = ROUND_POWER_OF_TWO(val, 5);
      } else {
        x = c + 1;
        y = (r << 6) - x * dy;
        const int base_y = y >> frac_bits_y;
        assert(base_y >= min_base_y);
        const int shift = ((y * (1 << upsample_left)) & 0x3F) >> 1;
        val = left[base_y] * (32 - shift) + left[base_y + 1] * shift;
        val = ROUND_POWER_OF_TWO(val, 5);
      }
      dst[c] = val;
    }
    dst += stride;
  }
}